

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::Texture3DMipmapTestInstance::~Texture3DMipmapTestInstance
          (Texture3DMipmapTestInstance *this)

{
  Texture3DMipmapTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DMipmapTestInstance_016b4e98;
  util::TextureRenderer::~TextureRenderer(&this->m_renderer);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::~SharedPtr(&this->m_texture);
  Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters(&this->m_testParameters);
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

Texture3DMipmapTestInstance::~Texture3DMipmapTestInstance (void)
{
}